

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

uint64_t __thiscall pstore::file::file_handle::tell(file_handle *this)

{
  int err_00;
  int *piVar1;
  string local_40;
  int local_1c;
  uint64_t uStack_18;
  int err;
  off_t r;
  file_handle *this_local;
  
  r = (off_t)this;
  ensure_open(this);
  uStack_18 = lseek(this->file_,0,1);
  if (uStack_18 == 0xffffffffffffffff) {
    piVar1 = __errno_location();
    err_00 = *piVar1;
    local_1c = err_00;
    path_abi_cxx11_(&local_40,this);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (err_00,"lseek/SEEK_CUR failed",&local_40);
  }
  if (-1 < (long)uStack_18) {
    return uStack_18;
  }
  assert_failed("r >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                ,0x11f);
}

Assistant:

std::uint64_t file_handle::tell () {
            this->ensure_open ();

            off_t const r = ::lseek (file_, off_t{0}, SEEK_CUR);
            if (r == off_t{-1}) {
                int const err = errno;
                raise_file_error (err, "lseek/SEEK_CUR failed", this->path ());
            }
            PSTORE_ASSERT (r >= 0);
            return static_cast<std::uint64_t> (r);
        }